

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeRows(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,SPxRowId *id,int n,int *perm)

{
  int iVar1;
  int *piVar2;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  int i;
  DataArray<int> p;
  SPxRowId *in_stack_ffffffffffffff88;
  DataArray<int> *in_stack_ffffffffffffff90;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  DataArray<int> *this_00;
  DataArray<int> *in_stack_ffffffffffffffa0;
  int local_48;
  DataArray<int> local_38;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_20;
  int local_14;
  undefined8 local_10;
  
  local_14 = in_EDX;
  if (in_RCX == (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0) {
    local_10 = in_RSI;
    nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x2c74a7);
    this_00 = &local_38;
    DataArray<int>::DataArray
              (in_stack_ffffffffffffffa0,(int)((ulong)this_00 >> 0x20),(int)this_00,
               (Real)in_stack_ffffffffffffff90);
    piVar2 = DataArray<int>::get_ptr(this_00);
    (**(code **)(*in_RDI + 0x90))(in_RDI,local_10,local_14,piVar2);
    DataArray<int>::~DataArray(in_stack_ffffffffffffff90);
  }
  else {
    local_20 = in_RCX;
    local_48 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x2c7533);
    while (local_48 = local_48 + -1, -1 < local_48) {
      *(int *)((long)&(local_20->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._vptr_ClassArray + (long)local_48 * 4) = local_48;
    }
    while (local_14 != 0) {
      pSVar3 = local_20;
      local_14 = local_14 + -1;
      iVar1 = number(local_20,in_stack_ffffffffffffff88);
      *(undefined4 *)
       ((long)&(pSVar3->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._vptr_ClassArray + (long)iVar1 * 4) = 0xffffffff;
    }
    local_14 = local_14 + -1;
    (**(code **)(*in_RDI + 0x88))(in_RDI,local_20);
  }
  return;
}

Assistant:

virtual void removeRows(SPxRowId id[], int n, int perm[] = nullptr)
   {

      if(perm == nullptr)
      {
         DataArray < int > p(nRows());
         removeRows(id, n, p.get_ptr());
         return;
      }

      for(int i = nRows() - 1; i >= 0; --i)
         perm[i] = i;

      while(n--)
         perm[number(id[n])] = -1;

      removeRows(perm);
   }